

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_encode_intra_block_plane
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int plane,RUN_TYPE dry_run,
               TRELLIS_OPT_TYPE enable_optimize_b)

{
  BLOCK_SIZE plane_bsize_00;
  int in_ECX;
  undefined4 in_EDX;
  macroblockd_plane *in_RSI;
  undefined4 in_R8D;
  char in_R9B;
  BLOCK_SIZE plane_bsize;
  encode_b_args arg;
  ENTROPY_CONTEXT tl [32];
  ENTROPY_CONTEXT ta [32];
  int ss_y;
  int ss_x;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff88;
  foreach_transformed_block_visitor in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  BLOCK_SIZE in_stack_ffffffffffffff9f;
  MACROBLOCKD *in_stack_ffffffffffffffa0;
  undefined1 local_58 [32];
  int local_38;
  int local_34;
  qm_val_t **local_30;
  qm_val_t **local_28;
  char local_1a;
  undefined1 local_19;
  BLOCK_SIZE local_11;
  
  local_11 = (BLOCK_SIZE)in_EDX;
  local_19 = (undefined1)in_R8D;
  local_28 = in_RSI->seg_iqmatrix[1] + 0xb;
  if ((in_ECX == 0) || ((*(byte *)((long)in_RSI->seg_iqmatrix[1] + 100) & 1) != 0)) {
    local_30 = in_RSI[in_ECX].seg_iqmatrix[1] + 0xd;
    local_34 = *(int *)((long)in_RSI[in_ECX].seg_iqmatrix[1] + 0x6c);
    local_38 = *(int *)(local_30 + 1);
    local_1a = in_R9B;
    memset(local_58,0,0x20);
    memset(&stack0xffffffffffffff88,0,0x20);
    plane_bsize_00 = get_plane_block_size(local_11,local_34,local_38);
    if (local_1a != '\0') {
      av1_get_entropy_contexts
                (plane_bsize_00,in_RSI,(ENTROPY_CONTEXT *)CONCAT44(in_EDX,in_ECX),
                 (ENTROPY_CONTEXT *)CONCAT44(in_R8D,in_stack_ffffffffffffff38));
    }
    av1_foreach_transformed_block_in_plane
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void av1_encode_intra_block_plane(const struct AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, int plane, RUN_TYPE dry_run,
                                  TRELLIS_OPT_TYPE enable_optimize_b) {
  assert(bsize < BLOCK_SIZES_ALL);
  const MACROBLOCKD *const xd = &x->e_mbd;
  if (plane && !xd->is_chroma_ref) return;

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  ENTROPY_CONTEXT ta[MAX_MIB_SIZE] = { 0 };
  ENTROPY_CONTEXT tl[MAX_MIB_SIZE] = { 0 };
  struct encode_b_args arg = {
    cpi, x, NULL, ta, tl, dry_run, enable_optimize_b
  };
  const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
  if (enable_optimize_b) {
    av1_get_entropy_contexts(plane_bsize, pd, ta, tl);
  }
  av1_foreach_transformed_block_in_plane(
      xd, plane_bsize, plane, encode_block_intra_and_set_context, &arg);
}